

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.cpp
# Opt level: O0

double __thiscall despot::QNode::Weight(QNode *this)

{
  bool bVar1;
  pointer ppVar2;
  double dVar3;
  _Self local_28;
  _Self local_20;
  const_iterator it;
  double weight;
  QNode *this_local;
  
  it._M_node = (_Base_ptr)0x0;
  local_20._M_node =
       (_Base_ptr)
       std::
       map<unsigned_long,_despot::VNode_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_despot::VNode_*>_>_>
       ::begin(&this->children_);
  while( true ) {
    local_28._M_node =
         (_Base_ptr)
         std::
         map<unsigned_long,_despot::VNode_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_despot::VNode_*>_>_>
         ::end(&this->children_);
    bVar1 = std::operator!=(&local_20,&local_28);
    if (!bVar1) break;
    ppVar2 = std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_despot::VNode_*>_>::
             operator->(&local_20);
    dVar3 = VNode::Weight(ppVar2->second);
    it._M_node = (_Base_ptr)(dVar3 + it._M_node);
    std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_despot::VNode_*>_>::operator++
              (&local_20,0);
  }
  return (double)it._M_node;
}

Assistant:

double QNode::Weight() const {
	double weight = 0;
	for (map<OBS_TYPE, VNode*>::const_iterator it = children_.begin();
		it != children_.end(); it++) {
		weight += it->second->Weight();
	}
	return weight;
}